

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Location * __thiscall
wabt::anon_unknown_15::BinaryReaderIR::GetLocation
          (Location *__return_storage_ptr__,BinaryReaderIR *this)

{
  Location *loc;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  BinaryReaderIR *local_10;
  BinaryReaderIR *this_local;
  
  local_10 = this;
  Location::Location(__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,this->filename_);
  (__return_storage_ptr__->filename)._M_len = local_20._M_len;
  (__return_storage_ptr__->filename)._M_str = local_20._M_str;
  (__return_storage_ptr__->field_1).field_1.offset =
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  return __return_storage_ptr__;
}

Assistant:

Location BinaryReaderIR::GetLocation() const {
  Location loc;
  loc.filename = filename_;
  loc.offset = state->offset;
  return loc;
}